

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O1

void count_components(void)

{
  int iVar1;
  ulong uVar2;
  
  freopen("components.txt","w",_stdout);
  iVar1 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::useddfs,(long)V,false);
  if (0 < V) {
    uVar2 = 0;
    iVar1 = 0;
    do {
      if ((*(ulong *)((anonymous_namespace)::useddfs + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0
         ) {
        if (DAT_001193c0 != (anonymous_namespace)::comp) {
          DAT_001193c0 = (anonymous_namespace)::comp;
        }
        dfs(0);
        iVar1 = iVar1 + 1;
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)V);
  }
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  return;
}

Assistant:

void count_components() {
    freopen("components.txt", "w", stdout); // output file

    int comp_num = 0;
    useddfs.resize(V, false);
    for (int i = 0; i < V; i++) {
        if (!useddfs[i]) {
            comp.clear();
            dfs(i);
            comp_num++;
        }
    }
    cout << comp_num;
}